

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall
smf::Binasc::readMidiEvent(Binasc *this,ostream *out,istream *infile,int *trackbytes,int *command)

{
  istream *piVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  string local_310 [32];
  int local_2f0;
  int local_2ec;
  int i_2;
  int i_1;
  double tempo;
  uint local_2d8;
  int number_1;
  int number;
  int length_1;
  int metatype;
  int local_2c4;
  int i;
  int length;
  string local_2a0 [32];
  Binasc local_280;
  string local_260 [32];
  Binasc local_240;
  string local_220 [33];
  byte local_1ff;
  byte local_1fe;
  byte local_1fd;
  int local_1fc;
  string local_1f8;
  char byte2;
  char byte1;
  uchar ch;
  int status;
  string comment;
  stringstream local_1c8 [8];
  stringstream output;
  ostream local_1b8 [380];
  int local_3c;
  uint *puStack_38;
  int vlv;
  int *command_local;
  int *trackbytes_local;
  istream *infile_local;
  ostream *out_local;
  Binasc *this_local;
  
  puStack_38 = (uint *)command;
  command_local = trackbytes;
  trackbytes_local = (int *)infile;
  infile_local = (istream *)out;
  out_local = (ostream *)this;
  local_3c = getVLV(this,infile,trackbytes);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar3 = std::operator<<(local_1b8,"v");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_3c);
  std::operator<<(poVar3,"\t");
  std::__cxx11::string::string(&local_1f8);
  local_1fc = 1;
  std::istream::read((char *)trackbytes_local,(long)&local_1fd);
  *command_local = *command_local + 1;
  if (local_1fd < 0x80) {
    std::operator<<(local_1b8,"   ");
  }
  else {
    pvVar4 = (void *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(pvVar4,(uint)local_1fd);
    *puStack_38 = (uint)local_1fd;
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
  }
  local_1fe = local_1fd;
  uVar2 = *puStack_38 & 0xf0;
  if (uVar2 == 0x80) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
    local_1ff = local_1fd;
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1ff);
    if (this->m_commentsQ != 0) {
      keyToPitchName_abi_cxx11_(&local_240,(int)(char)local_1fe);
      std::operator+((char *)local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "note-off ");
      std::__cxx11::string::operator+=(&local_1f8,local_220);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
  }
  else if (uVar2 == 0x90) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
    local_1ff = local_1fd;
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1ff);
    if (this->m_commentsQ != 0) {
      if (local_1ff == 0) {
        keyToPitchName_abi_cxx11_(&local_280,(int)(char)local_1fe);
        std::operator+((char *)local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "note-off ");
        std::__cxx11::string::operator+=(&local_1f8,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string((string *)&local_280);
      }
      else {
        keyToPitchName_abi_cxx11_((Binasc *)&i,(int)(char)local_1fe);
        std::operator+((char *)local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "note-on ");
        std::__cxx11::string::operator+=(&local_1f8,local_2a0);
        std::__cxx11::string::~string(local_2a0);
        std::__cxx11::string::~string((string *)&i);
      }
    }
  }
  else if (uVar2 == 0xa0) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
    local_1ff = local_1fd;
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1ff);
    if (this->m_commentsQ != 0) {
      std::__cxx11::string::operator+=(&local_1f8,"after-touch");
    }
  }
  else if (uVar2 == 0xb0) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
    local_1ff = local_1fd;
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1ff);
    if (this->m_commentsQ != 0) {
      std::__cxx11::string::operator+=(&local_1f8,"controller");
    }
  }
  else if (uVar2 == 0xc0) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    if (this->m_commentsQ != 0) {
      std::operator<<(local_1b8,"\t");
      std::__cxx11::string::operator+=(&local_1f8,"patch-change");
    }
  }
  else if (uVar2 == 0xd0) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    if (this->m_commentsQ != 0) {
      std::__cxx11::string::operator+=(&local_1f8,"channel pressure");
    }
  }
  else if (uVar2 == 0xe0) {
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1fe);
    std::istream::read((char *)trackbytes_local,(long)&local_1fd);
    *command_local = *command_local + 1;
    local_1ff = local_1fd;
    poVar3 = std::operator<<(local_1b8," \'");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(int)(char)local_1ff);
    if (this->m_commentsQ != 0) {
      std::__cxx11::string::operator+=(&local_1f8,"pitch-bend");
    }
  }
  else if (uVar2 == 0xf0) {
    switch(*puStack_38) {
    case 0xf0:
      break;
    case 0xf1:
      break;
    case 0xf2:
      break;
    case 0xf3:
      break;
    case 0xf4:
      break;
    case 0xf5:
      break;
    case 0xf6:
      break;
    case 0xf7:
      std::istream::putback((char)trackbytes_local);
      *command_local = *command_local + -1;
      local_2c4 = getVLV(this,(istream *)trackbytes_local,command_local);
      poVar3 = std::operator<<(local_1b8," v");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
      std::ostream::operator<<(pvVar4,local_2c4);
      for (metatype = 0; metatype < local_2c4; metatype = metatype + 1) {
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        if (local_1fd < 0x10) {
          poVar3 = std::operator<<(local_1b8," 0");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
          std::ostream::operator<<(pvVar4,(uint)local_1fd);
        }
        else {
          poVar3 = std::operator<<(local_1b8," ");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
          std::ostream::operator<<(pvVar4,(uint)local_1fd);
        }
      }
      break;
    case 0xf8:
      break;
    case 0xf9:
      break;
    case 0xfa:
      break;
    case 0xfb:
      break;
    case 0xfc:
      break;
    case 0xfd:
      break;
    case 0xfe:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error command not yet handled");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
      goto LAB_00157b51;
    case 0xff:
      number = (int)local_1fd;
      poVar3 = std::operator<<(local_1b8," ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      std::ostream::operator<<(pvVar4,number);
      number_1 = getVLV(this,(istream *)trackbytes_local,command_local);
      poVar3 = std::operator<<(local_1b8," v");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
      std::ostream::operator<<(pvVar4,number_1);
      switch(number) {
      case 0:
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        local_2d8 = (uint)local_1fd;
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        local_2d8 = local_2d8 << 8 | (uint)local_1fd;
        poVar3 = std::operator<<(local_1b8," 2\'");
        std::ostream::operator<<(poVar3,local_2d8);
        break;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
        std::operator<<(local_1b8," \"");
        for (local_2ec = 0; local_2ec < number_1; local_2ec = local_2ec + 1) {
          std::istream::read((char *)trackbytes_local,(long)&local_1fd);
          *command_local = *command_local + 1;
          std::operator<<(local_1b8,local_1fd);
        }
        std::operator<<(local_1b8,"\"");
        break;
      default:
        for (local_2f0 = 0; local_2f0 < number_1; local_2f0 = local_2f0 + 1) {
          std::istream::read((char *)trackbytes_local,(long)&local_1fd);
          *command_local = *command_local + 1;
          std::operator<<(local_1b8," ");
          if (local_1fd < 0x10) {
            std::operator<<(local_1b8,"0");
          }
          pvVar4 = (void *)std::ostream::operator<<(local_1b8,std::hex);
          std::ostream::operator<<(pvVar4,(uint)local_1fd);
        }
        break;
      case 0x20:
      case 0x21:
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        break;
      case 0x51:
        tempo._4_4_ = 0;
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        tempo._4_4_ = tempo._4_4_ << 8 | (uint)local_1fd;
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        tempo._4_4_ = tempo._4_4_ << 8 | (uint)local_1fd;
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        tempo._4_4_ = tempo._4_4_ << 8 | (uint)local_1fd;
        _i_2 = (1000000.0 / (double)(int)tempo._4_4_) * 60.0;
        poVar3 = std::operator<<(local_1b8," t");
        std::ostream::operator<<(poVar3,_i_2);
        break;
      case 0x54:
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        break;
      case 0x58:
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        break;
      case 0x59:
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
        std::istream::read((char *)trackbytes_local,(long)&local_1fd);
        *command_local = *command_local + 1;
        poVar3 = std::operator<<(local_1b8," \'");
        std::ostream::operator<<(poVar3,(uint)local_1fd);
      }
      switch(number) {
      case 0:
        std::__cxx11::string::operator+=(&local_1f8,"sequence number");
        break;
      case 1:
        std::__cxx11::string::operator+=(&local_1f8,"text");
        break;
      case 2:
        std::__cxx11::string::operator+=(&local_1f8,"copyright notice");
        break;
      case 3:
        std::__cxx11::string::operator+=(&local_1f8,"track name");
        break;
      case 4:
        std::__cxx11::string::operator+=(&local_1f8,"instrument name");
        break;
      case 5:
        std::__cxx11::string::operator+=(&local_1f8,"lyric");
        break;
      case 6:
        std::__cxx11::string::operator+=(&local_1f8,"marker");
        break;
      case 7:
        std::__cxx11::string::operator+=(&local_1f8,"cue point");
        break;
      case 8:
        std::__cxx11::string::operator+=(&local_1f8,"program name");
        break;
      case 9:
        std::__cxx11::string::operator+=(&local_1f8,"device name");
        break;
      default:
        std::__cxx11::string::operator+=(&local_1f8,"meta-message");
        break;
      case 0x20:
        std::__cxx11::string::operator+=(&local_1f8,"MIDI channel prefix");
        break;
      case 0x21:
        std::__cxx11::string::operator+=(&local_1f8,"MIDI port");
        break;
      case 0x2f:
        local_1fc = 0;
        std::__cxx11::string::operator+=(&local_1f8,"end-of-track");
        break;
      case 0x51:
        std::__cxx11::string::operator+=(&local_1f8,"tempo");
        break;
      case 0x54:
        std::__cxx11::string::operator+=(&local_1f8,"SMPTE offset");
        break;
      case 0x58:
        std::__cxx11::string::operator+=(&local_1f8,"time signature");
        break;
      case 0x59:
        std::__cxx11::string::operator+=(&local_1f8,"key signature");
        break;
      case 0x7f:
        std::__cxx11::string::operator+=(&local_1f8,"system exclusive");
      }
    }
  }
  piVar1 = infile_local;
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)piVar1,local_310);
  std::__cxx11::string::~string(local_310);
  if (this->m_commentsQ != 0) {
    poVar3 = std::operator<<((ostream *)infile_local,"\t; ");
    std::operator<<(poVar3,&local_1f8);
  }
  this_local._4_4_ = local_1fc;
LAB_00157b51:
  length_1 = 1;
  std::__cxx11::string::~string(&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return this_local._4_4_;
}

Assistant:

int Binasc::readMidiEvent(std::ostream& out, std::istream& infile,
		int& trackbytes, int& command) {

	// Read and print Variable Length Value for delta ticks
	int vlv = getVLV(infile, trackbytes);

	std::stringstream output;

	output << "v" << std::dec << vlv << "\t";

	std::string comment;

	int status = 1;
	uchar ch;
	char byte1, byte2;
	infile.read((char*)&ch, 1);
	trackbytes++;
	if (ch < 0x80) {
		// running status: command byte is previous one in data stream
		output << "   ";
	} else {
		// midi command byte
		output << std::hex << (int)ch;
		command = ch;
		infile.read((char*)&ch, 1);
		trackbytes++;
	}
	byte1 = ch;
	switch (command & 0xf0) {
		case 0x80:    // note-off: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "note-off " + keyToPitchName(byte1);
			}
			break;
		case 0x90:    // note-on: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				if (byte2 == 0) {
					comment += "note-off " + keyToPitchName(byte1);
				} else {
					comment += "note-on " + keyToPitchName(byte1);
				}
			}
			break;
		case 0xA0:    // aftertouch: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "after-touch";
			}
			break;
		case 0xB0:    // continuous controller: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "controller";
			}
			break;
		case 0xE0:    // pitch-bend: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "pitch-bend";
			}
			break;
		case 0xC0:    // patch change: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				output << "\t";
				comment += "patch-change";
			}
			break;
		case 0xD0:    // channel pressure: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				comment += "channel pressure";
			}
			break;
		case 0xF0:    // various system bytes: variable bytes
			switch (command) {
				case 0xf0:
					break;
				case 0xf7:
					// Read the first byte which is either 0xf0 or 0xf7.
					// Then a VLV byte count for the number of bytes
					// that remain in the message will follow.
					// Then read that number of bytes.
					{
					infile.putback(byte1);
					trackbytes--;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					for (int i=0; i<length; i++) {
						infile.read((char*)&ch, 1);
						trackbytes++;
						if (ch < 0x10) {
						   output << " 0" << std::hex << (int)ch;
						} else {
						   output << " " << std::hex << (int)ch;
						}
					}
					}
					break;
				case 0xf1:
					break;
				case 0xf2:
					break;
				case 0xf3:
					break;
				case 0xf4:
					break;
				case 0xf5:
					break;
				case 0xf6:
					break;
				case 0xf8:
					break;
				case 0xf9:
					break;
				case 0xfa:
					break;
				case 0xfb:
					break;
				case 0xfc:
					break;
				case 0xfd:
					break;
				case 0xfe:
					std::cerr << "Error command not yet handled" << std::endl;
					return 0;
					break;
				case 0xff:  // meta message
					{
					int metatype = ch;
					output << " " << std::hex << metatype;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					switch (metatype) {

						case 0x00:  // sequence number
						   // display two-byte big-endian decimal value.
						   {
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   int number = ch;
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   number = (number << 8) | ch;
						   output << " 2'" << number;
						   }
						   break;

						case 0x20: // MIDI channel prefix
						case 0x21: // MIDI port
						   // display single-byte decimal number
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   output << " '" << (int)ch;
						   break;

						case 0x51: // Tempo
						    // display tempo as "t" word.
						    {
						    int number = 0;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    double tempo = 1000000.0 / number * 60.0;
						    output << " t" << tempo;
						    }
						    break;

						case 0x54: // SMPTE offset
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // hour
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // minutes
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // seconds
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // frames
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // subframes
						    break;

						case 0x58: // time signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // numerator
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // denominator power
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // clocks per beat
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // 32nd notes per beat
						    break;

						case 0x59: // key signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // accidentals
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // mode
						    break;

						case 0x01: // text
						case 0x02: // copyright
						case 0x03: // track name
						case 0x04: // instrument name
						case 0x05: // lyric
						case 0x06: // marker
						case 0x07: // cue point
						case 0x08: // program name
						case 0x09: // device name
						   output << " \"";
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << (char)ch;
						   }
						   output << "\"";
						   break;
						default:
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << " ";
						      if (ch < 0x10) {
						         output << "0";
						      }
						      output << std::hex << (int)ch;
						   }
					}
					switch (metatype) {
						case 0x00: comment += "sequence number";     break;
						case 0x01: comment += "text";                break;
						case 0x02: comment += "copyright notice";    break;
						case 0x03: comment += "track name";          break;
						case 0x04: comment += "instrument name";     break;
						case 0x05: comment += "lyric";               break;
						case 0x06: comment += "marker";              break;
						case 0x07: comment += "cue point";           break;
						case 0x08: comment += "program name";        break;
						case 0x09: comment += "device name";         break;
						case 0x20: comment += "MIDI channel prefix"; break;
						case 0x21: comment += "MIDI port";           break;
						case 0x51: comment += "tempo";               break;
						case 0x54: comment += "SMPTE offset";        break;
						case 0x58: comment += "time signature";      break;
						case 0x59: comment += "key signature";       break;
						case 0x7f: comment += "system exclusive";    break;
						case 0x2f:
						   status = 0;
						   comment += "end-of-track";
						   break;
						default:
						   comment += "meta-message";
					}
					}
					break;

			}
			break;
	}

	out << output.str();
	if (m_commentsQ) {
		out << "\t; " << comment;
	}

	return status;
}